

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printAM2PreOrOffsetIndexOp(MCInst *MI,uint Op,SStream *O)

{
  cs_struct *pcVar1;
  ARM_AM_AddrOpc AVar2;
  uint uVar3;
  ARM_AM_AddrOpc AVar4;
  ARM_AM_ShiftOpc ShOpc;
  MCOperand *op;
  MCOperand *op_00;
  MCOperand *op_01;
  int64_t iVar5;
  char *pcVar6;
  uint tmp;
  ARM_AM_AddrOpc subtracted;
  MCOperand *MO3;
  MCOperand *MO2;
  MCOperand *MO1;
  SStream *O_local;
  uint Op_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,Op);
  op_00 = MCInst_getOperand(MI,Op + 1);
  op_01 = MCInst_getOperand(MI,Op + 2);
  iVar5 = MCOperand_getImm(op_01);
  AVar2 = getAM2Op((uint)iVar5);
  SStream_concat0(O,"[");
  set_mem_access(MI,true);
  pcVar1 = MI->csh;
  uVar3 = MCOperand_getReg(op);
  printRegName(pcVar1,O,uVar3);
  if (MI->csh->detail != CS_OPT_OFF) {
    uVar3 = MCOperand_getReg(op);
    *(uint *)(MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar3;
  }
  uVar3 = MCOperand_getReg(op_00);
  if (uVar3 == 0) {
    iVar5 = MCOperand_getImm(op_01);
    uVar3 = getAM2Offset((uint)iVar5);
    if (uVar3 != 0) {
      iVar5 = MCOperand_getImm(op_01);
      AVar2 = getAM2Op((uint)iVar5);
      SStream_concat0(O,", ");
      if (uVar3 < 10) {
        pcVar6 = ARM_AM_getAddrOpcStr(AVar2);
        SStream_concat(O,"#%s%u",pcVar6,(ulong)uVar3);
      }
      else {
        pcVar6 = ARM_AM_getAddrOpcStr(AVar2);
        SStream_concat(O,"#%s0x%x",pcVar6,(ulong)uVar3);
      }
      if (MI->csh->detail != CS_OPT_OFF) {
        iVar5 = MCOperand_getImm(op_01);
        AVar4 = getAM2Op((uint)iVar5);
        *(ARM_AM_AddrOpc *)
         (MI->flat_insn->detail->groups +
         (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x3a) = AVar4;
        *(uint *)(MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x3e) = uVar3;
        MI->flat_insn->detail->groups
        [(ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x56] = AVar2 == ARM_AM_sub;
      }
    }
    SStream_concat0(O,"]");
    set_mem_access(MI,false);
  }
  else {
    SStream_concat0(O,", ");
    pcVar6 = ARM_AM_getAddrOpcStr(AVar2);
    SStream_concat0(O,pcVar6);
    pcVar1 = MI->csh;
    uVar3 = MCOperand_getReg(op_00);
    printRegName(pcVar1,O,uVar3);
    if (MI->csh->detail != CS_OPT_OFF) {
      uVar3 = MCOperand_getReg(op_00);
      *(uint *)(MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x4a) = uVar3;
      MI->flat_insn->detail->groups
      [(ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x56] = AVar2 == ARM_AM_sub;
    }
    iVar5 = MCOperand_getImm(op_01);
    ShOpc = getAM2ShiftOpc((uint)iVar5);
    iVar5 = MCOperand_getImm(op_01);
    uVar3 = getAM2Offset((uint)iVar5);
    printRegImmShift(MI,O,ShOpc,uVar3);
    SStream_concat0(O,"]");
    set_mem_access(MI,false);
  }
  return;
}

Assistant:

static void printAM2PreOrOffsetIndexOp(MCInst *MI, unsigned Op, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, Op);
	MCOperand *MO2 = MCInst_getOperand(MI, Op + 1);
	MCOperand *MO3 = MCInst_getOperand(MI, Op + 2);
	ARM_AM_AddrOpc subtracted = getAM2Op((unsigned int)MCOperand_getImm(MO3));

	SStream_concat0(O, "[");
	set_mem_access(MI, true);

	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);
	}

	if (!MCOperand_getReg(MO2)) {
		unsigned tmp = getAM2Offset((unsigned int)MCOperand_getImm(MO3));
		if (tmp) { // Don't print +0.
			subtracted = getAM2Op((unsigned int)MCOperand_getImm(MO3));

			SStream_concat0(O, ", ");
			if (tmp > HEX_THRESHOLD)
				SStream_concat(O, "#%s0x%x", ARM_AM_getAddrOpcStr(subtracted), tmp);
			else
				SStream_concat(O, "#%s%u", ARM_AM_getAddrOpcStr(subtracted), tmp);
			if (MI->csh->detail) {
				MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].shift.type = (arm_shifter)getAM2Op((unsigned int)MCOperand_getImm(MO3));
				MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].shift.value = tmp;
				MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].subtracted = subtracted == ARM_AM_sub;
			}
		}
		SStream_concat0(O, "]");
		set_mem_access(MI, false);
		return;
	}

	SStream_concat0(O, ", ");
	SStream_concat0(O, ARM_AM_getAddrOpcStr(subtracted));
	printRegName(MI->csh, O, MCOperand_getReg(MO2));
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.index = MCOperand_getReg(MO2);
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].subtracted = subtracted == ARM_AM_sub;
	}

	printRegImmShift(MI, O, getAM2ShiftOpc((unsigned int)MCOperand_getImm(MO3)),
			getAM2Offset((unsigned int)MCOperand_getImm(MO3)));
	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}